

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsReceiveQueue.cpp
# Opt level: O3

BufferPtr __thiscall Scs::ReceiveQueue::Pop(ReceiveQueue *this)

{
  _Elt_pointer psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  deque<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
  *in_RSI;
  BufferPtr BVar4;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)(in_RSI + 1));
  if (iVar3 == 0) {
    psVar1 = (in_RSI->
             super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((in_RSI->
        super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
        )._M_impl.super__Deque_impl_data._M_finish._M_cur == psVar1) {
      (this->m_queue).c.
      super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      (this->m_queue).c.
      super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size = 0;
    }
    else {
      (this->m_queue).c.
      super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map =
           (_Map_pointer)
           (psVar1->
           super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
      p_Var2 = (psVar1->
               super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_refcount._M_pi;
      (this->m_queue).c.
      super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size = (size_t)p_Var2;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      std::
      deque<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
      ::pop_front(in_RSI);
    }
    pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 1));
    BVar4.
    super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = extraout_RDX._M_pi;
    BVar4.
    super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)this;
    return (BufferPtr)
           BVar4.
           super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

BufferPtr ReceiveQueue::Pop()
{
	std::lock_guard<std::mutex> lock(m_mutex);
	if (m_queue.empty())
		return nullptr;
	BufferPtr buffer = m_queue.front();
	m_queue.pop();
	return buffer;
}